

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_pass_to_lower_layer.c
# Opt level: O3

zip_int64_t
zip_source_pass_to_lower_layer
          (zip_source_t *src,void *data,zip_uint64_t length,zip_source_cmd_t command)

{
  zip_int64_t zVar1;
  int ze;
  
  switch(command) {
  case ZIP_SOURCE_OPEN:
  case ZIP_SOURCE_CLOSE:
  case ZIP_SOURCE_FREE:
  case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
  case ZIP_SOURCE_SUPPORTS_REOPEN:
    return 0;
  case ZIP_SOURCE_READ:
  case ZIP_SOURCE_ERROR:
  case ZIP_SOURCE_SEEK:
  case ZIP_SOURCE_TELL:
  case ZIP_SOURCE_ACCEPT_EMPTY:
  case ZIP_SOURCE_GET_DOS_TIME:
    zVar1 = _zip_source_call(src,data,length,command);
    return zVar1;
  case ZIP_SOURCE_STAT:
    return 0x40;
  default:
    ze = 0x1c;
    break;
  case ZIP_SOURCE_SUPPORTS:
    if (7 < length) {
      return *data;
    }
    ze = 0x14;
  }
  zip_error_set(&src->error,ze,0);
  return -1;
}

Assistant:

zip_int64_t zip_source_pass_to_lower_layer(zip_source_t *src, void *data, zip_uint64_t length, zip_source_cmd_t command) {
    switch (command) {
    case ZIP_SOURCE_OPEN:
    case ZIP_SOURCE_CLOSE:
    case ZIP_SOURCE_FREE:
    case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
    case ZIP_SOURCE_SUPPORTS_REOPEN:
        return 0;

    case ZIP_SOURCE_STAT:
        return sizeof(zip_stat_t);

    case ZIP_SOURCE_ACCEPT_EMPTY:
    case ZIP_SOURCE_ERROR:
    case ZIP_SOURCE_GET_DOS_TIME:
    case ZIP_SOURCE_READ:
    case ZIP_SOURCE_SEEK:
    case ZIP_SOURCE_TELL:
        return _zip_source_call(src, data, length, command);

    case ZIP_SOURCE_BEGIN_WRITE:
    case ZIP_SOURCE_BEGIN_WRITE_CLONING:
    case ZIP_SOURCE_COMMIT_WRITE:
    case ZIP_SOURCE_REMOVE:
    case ZIP_SOURCE_ROLLBACK_WRITE:
    case ZIP_SOURCE_SEEK_WRITE:
    case ZIP_SOURCE_TELL_WRITE:
    case ZIP_SOURCE_WRITE:
        zip_error_set(&src->error, ZIP_ER_OPNOTSUPP, 0);
        return -1;

    case ZIP_SOURCE_SUPPORTS:
        if (length < sizeof(zip_int64_t)) {
            zip_error_set(&src->error, ZIP_ER_INTERNAL, 0);
            return -1;
        }
        return *(zip_int64_t *)data;

    default:
        zip_error_set(&src->error, ZIP_ER_OPNOTSUPP, 0);
        return -1;
    }
}